

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O2

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Inst *pIVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ostream *this_00;
  int b;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  size_type __n;
  bool bVar21;
  uint local_278;
  ulong local_270;
  PODArray<int> nodebyid;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  PODArray<re2::InstCond> stack;
  int local_210;
  Instq workq;
  Instq tovisit;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar21 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      lVar18 = (long)this->inst_count_[2] + 2;
      iVar2 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar2;
      if (lVar18 <= (this->dfa_mem_ / 4) / (long)__n) {
        PODArray<re2::InstCond>::PODArray
                  (&stack,this->inst_count_[6] + this->inst_count_[3] + this->inst_count_[4] + 1);
        iVar9 = this->size_;
        PODArray<int>::PODArray(&nodebyid,iVar9);
        memset(nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl,0xff,(long)iVar9 << 2);
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&tovisit,iVar9);
        SparseSetT<void>::SparseSetT(&workq,iVar9);
        AddQ(&tovisit,this->start_);
        nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                  (&nodes,(const_iterator)
                          nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
        iVar9 = 1;
        _Var16 = tovisit.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>;
        do {
          piVar1 = tovisit.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + tovisit.size_;
          if (_Var16._M_head_impl == piVar1) {
            iVar9 = iVar9 * iVar2;
            this->dfa_mem_ = this->dfa_mem_ - (long)iVar9;
            PODArray<unsigned_char>::PODArray((PODArray<unsigned_char> *)&local_1b0,iVar9);
            std::__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>::operator=
                      ((__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter> *)
                       &this->onepass_nodes_,
                       (__uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter> *)
                       &local_1b0);
            std::unique_ptr<unsigned_char[],_re2::PODArray<unsigned_char>::Deleter>::~unique_ptr
                      ((unique_ptr<unsigned_char[],_re2::PODArray<unsigned_char>::Deleter> *)
                       &local_1b0);
            memmove((this->onepass_nodes_).ptr_._M_t.
                    super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                    nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,(long)iVar9);
LAB_001a7706:
            SparseSetT<void>::~SparseSetT(&workq);
            SparseSetT<void>::~SparseSetT(&tovisit);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            std::unique_ptr<int[],_re2::PODArray<int>::Deleter>::~unique_ptr(&nodebyid.ptr_);
            std::unique_ptr<re2::InstCond[],_re2::PODArray<re2::InstCond>::Deleter>::~unique_ptr
                      (&stack.ptr_);
            return _Var16._M_head_impl == piVar1;
          }
          iVar4 = *_Var16._M_head_impl;
          iVar5 = nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl[iVar4];
          puVar20 = (uint *)(nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar5 * iVar2);
          for (lVar11 = 0; lVar11 < this->bytemap_range_; lVar11 = lVar11 + 1) {
            puVar20[lVar11 + 1] = 0x30;
          }
          *puVar20 = 0x30;
          workq.size_ = 0;
          (stack.ptr_._M_t.
           super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
           super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl)->id = iVar4;
          (stack.ptr_._M_t.
           super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
           super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl)->cond = 0;
          bVar21 = false;
          local_270 = 1;
LAB_001a7362:
          if (0 < (int)local_270) {
            local_270 = (ulong)((int)local_270 - 1);
            uVar12 = (ulong)(uint)stack.ptr_._M_t.
                                  super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>
                                  .super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl
                                  [local_270].id;
            local_278 = stack.ptr_._M_t.
                        super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>.
                        _M_t.
                        super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>
                        .super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[local_270].cond;
LAB_001a7384:
            lVar11 = (long)(int)uVar12;
LAB_001a7387:
            pIVar6 = (this->inst_).ptr_._M_t.
                     super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                     .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
            uVar17 = pIVar6[lVar11].out_opcode_;
            iVar4 = (int)lVar11;
            switch(uVar17 & 7) {
            case 0:
              LogMessage::LogMessage
                        (&local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/onepass.cc"
                         ,0x1bf);
              this_00 = std::operator<<((ostream *)&local_1b0.str_,"unhandled opcode: ");
              std::ostream::operator<<(this_00,pIVar6[lVar11].out_opcode_ & 7);
              LogMessage::~LogMessage(&local_1b0);
              goto LAB_001a7362;
            case 1:
              goto switchD_001a73a3_caseD_1;
            case 2:
              goto switchD_001a73a3_caseD_2;
            default:
              if ((uVar17 & 8) == 0) {
                bVar7 = AddQ(&workq,iVar4 + 1);
                if (!bVar7) goto LAB_001a7706;
                lVar10 = (long)(int)local_270;
                stack.ptr_._M_t.
                super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[lVar10].id = iVar4 + 1;
                local_270 = (ulong)((int)local_270 + 1);
                stack.ptr_._M_t.
                super___uniq_ptr_impl<re2::InstCond,_re2::PODArray<re2::InstCond>::Deleter>._M_t.
                super__Tuple_impl<0UL,_re2::InstCond_*,_re2::PODArray<re2::InstCond>::Deleter>.
                super__Head_base<0UL,_re2::InstCond_*,_false>._M_head_impl[lVar10].cond = local_278;
                uVar17 = pIVar6[lVar11].out_opcode_;
              }
              if ((uVar17 & 7) == 4) {
                local_278 = local_278 | pIVar6[lVar11].field_1.out1_;
              }
              else if (((uVar17 & 7) == 3) && ((int)pIVar6[lVar11].field_1.field_3 < 10)) {
                local_278 = local_278 | 0x20 << (pIVar6[lVar11].field_1.field_3.lo_ & 0x1f);
              }
              bVar7 = AddQ(&workq,uVar17 >> 4);
              if (!bVar7) goto LAB_001a7706;
              uVar12 = (ulong)(pIVar6[lVar11].out_opcode_ >> 4);
              goto LAB_001a7384;
            case 5:
              if (bVar21) goto LAB_001a7706;
              *puVar20 = local_278;
              if ((pIVar6[lVar11].out_opcode_ & 8) == 0) {
                bVar7 = AddQ(&workq,iVar4 + 1);
                bVar21 = true;
                goto LAB_001a75b2;
              }
              bVar21 = true;
            case 7:
              goto LAB_001a7362;
            }
          }
          _Var16._M_head_impl = _Var16._M_head_impl + 1;
        } while( true );
      }
    }
    bVar21 = false;
  }
  return bVar21;
switchD_001a73a3_caseD_2:
  iVar13 = nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar17 >> 4];
  iVar8 = iVar9;
  if (nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[uVar17 >> 4] == -1) {
    local_210 = (int)lVar18;
    if (local_210 <= iVar9) goto LAB_001a7706;
    AddQ(&tovisit,uVar17 >> 4);
    nodebyid.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[pIVar6[lVar11].out_opcode_ >> 4] = iVar9;
    local_1b0.flushed_ = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (&nodes,(const_iterator)
                      nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
    iVar8 = iVar9 + 1;
    puVar20 = (uint *)(nodes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + iVar5 * iVar2);
    iVar13 = iVar9;
  }
  uVar12 = (ulong)pIVar6[lVar11].field_1.field_3.lo_;
  uVar14 = iVar13 << 0x10 | local_278;
  uVar17 = uVar14 | 0x40;
  if (!bVar21) {
    uVar17 = uVar14;
  }
  while( true ) {
    bVar3 = pIVar6[lVar11].field_1.field_3.hi_;
    iVar9 = (int)uVar12;
    if ((int)(uint)bVar3 < iVar9) break;
    bVar3 = this->bytemap_[iVar9];
    uVar19 = (long)iVar9;
    do {
      if (uVar19 == 0xff) {
        uVar12 = 0x100;
        break;
      }
      uVar12 = uVar19 + 1;
      lVar10 = uVar19 + 1;
      uVar19 = uVar12;
    } while (this->bytemap_[lVar10] == bVar3);
    if ((~puVar20[(ulong)bVar3 + 1] & 0x30) == 0) {
      puVar20[(ulong)bVar3 + 1] = uVar17;
    }
    else if (puVar20[(ulong)bVar3 + 1] != uVar17) goto LAB_001a7706;
  }
  if ((pIVar6[lVar11].field_1.out1_ & 0x10000) != 0) {
    aVar15 = pIVar6[lVar11].field_1.field_3;
    if (aVar15.lo_ < 0x62) {
      aVar15.lo_ = 'a';
      aVar15.hi_ = '\0';
      aVar15.hint_foldcase_ = 0;
    }
    uVar12 = (ulong)(((uint)aVar15 & 0xff) - 0x20);
    uVar14 = (uint)bVar3;
    if (0x79 < bVar3) {
      uVar14 = 0x7a;
    }
    while (iVar9 = (int)uVar12, iVar9 <= (int)(uVar14 - 0x20)) {
      bVar3 = this->bytemap_[iVar9];
      uVar19 = (long)iVar9;
      do {
        if (uVar19 == 0xff) {
          uVar12 = 0x100;
          break;
        }
        uVar12 = uVar19 + 1;
        lVar10 = uVar19 + 1;
        uVar19 = uVar12;
      } while (this->bytemap_[lVar10] == bVar3);
      if ((~puVar20[(ulong)bVar3 + 1] & 0x30) == 0) {
        puVar20[(ulong)bVar3 + 1] = uVar17;
      }
      else if (puVar20[(ulong)bVar3 + 1] != uVar17) goto LAB_001a7706;
    }
  }
  iVar9 = iVar8;
  if ((pIVar6[lVar11].out_opcode_ & 8) != 0) goto LAB_001a7362;
  bVar7 = AddQ(&workq,iVar4 + 1);
LAB_001a75b2:
  uVar12 = lVar11 + 1;
  if (bVar7 == false) goto LAB_001a7706;
  goto LAB_001a7384;
switchD_001a73a3_caseD_1:
  bVar7 = AddQ(&workq,iVar4 + 1);
  lVar11 = lVar11 + 1;
  if (!bVar7) goto LAB_001a7706;
  goto LAB_001a7387;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}